

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fms.c
# Opt level: O0

int FmsDataCollectionAddFieldDescriptor(FmsDataCollection dc,char *fd_name,FmsFieldDescriptor *fd)

{
  ulong uVar1;
  int iVar2;
  char *str;
  void *pvVar3;
  char **str_copy_p;
  undefined8 *in_RDX;
  long in_RDI;
  FmsFieldDescriptor new_fd;
  FmsInt nc;
  FmsFieldDescriptor *fds;
  FmsInt num_fds;
  int local_4;
  
  if (in_RDI == 0) {
    local_4 = 1;
  }
  else if (in_RDX == (undefined8 *)0x0) {
    local_4 = 2;
  }
  else {
    uVar1 = *(ulong *)(in_RDI + 0x18);
    pvVar3 = *(void **)(in_RDI + 0x20);
    str = (char *)NextPow2(uVar1 + 1);
    if (uVar1 <= (ulong)str >> 1) {
      pvVar3 = realloc(pvVar3,(long)str << 3);
      if (pvVar3 == (void *)0x0) {
        return 3;
      }
      *(void **)(in_RDI + 0x20) = pvVar3;
    }
    str_copy_p = (char **)calloc(1,0x28);
    if (str_copy_p == (char **)0x0) {
      local_4 = 3;
    }
    else {
      iVar2 = FmsCopyString(str,str_copy_p);
      if (iVar2 == 0) {
        *(ulong *)(in_RDI + 0x18) = uVar1 + 1;
        *(char ***)(*(long *)(in_RDI + 0x20) + uVar1 * 8) = str_copy_p;
        *in_RDX = str_copy_p;
        local_4 = 0;
      }
      else {
        free(str_copy_p);
        local_4 = 3;
      }
    }
  }
  return local_4;
}

Assistant:

int FmsDataCollectionAddFieldDescriptor(FmsDataCollection dc,
                                        const char *fd_name,
                                        FmsFieldDescriptor *fd) {
  if (!dc) { E_RETURN(1); }
  if (!fd) { E_RETURN(2); }
  const FmsInt num_fds = dc->num_fds;
  FmsFieldDescriptor *fds = dc->fds;
  // Reallocate dc->fds, if necessary
  const FmsInt nc = NextPow2(num_fds + 1);
  if (num_fds <= nc/2) {
    fds = realloc(fds, nc*sizeof(*fds));
    if (fds == NULL) { E_RETURN(3); }
    dc->fds = fds;
  }
  FmsFieldDescriptor new_fd;
  new_fd = calloc(1, sizeof(*new_fd));
  if (new_fd == NULL) { E_RETURN(3); }
  // On error, call free(new_fd)
  if (FmsCopyString(fd_name, &new_fd->name)) { free(new_fd); E_RETURN(3); }
  // Update the field descriptor
  dc->num_fds = num_fds + 1;
  dc->fds[num_fds] = new_fd;
  *fd = new_fd;
  return 0;
}